

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O1

void __thiscall SQCompilation::CodegenVisitor::visitCallExpr(CodegenVisitor *this,CallExpr *call)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  TreeOp TVar3;
  Expr **ppEVar4;
  undefined1 auVar5 [12];
  SQObject SVar6;
  SQObject SVar7;
  unkbyte10 Var8;
  SQObjectValue SVar9;
  Node *this_00;
  SQInteger SVar10;
  SQInteger SVar11;
  SQInteger SVar12;
  SQInteger SVar13;
  undefined1 uVar14;
  SQFuncState *pSVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  byte bVar19;
  bool local_59;
  undefined1 local_58 [6];
  undefined1 uStack_52;
  byte bStack_51;
  SQObjectValue local_50;
  SQInteger local_48;
  SQInteger local_40;
  SQInteger local_38;
  
  maybeAddInExprLine(this,&call->super_Expr);
  this_00 = &deparen(this,call->_callee)->super_Node;
  if (this_00->_op == TO_GETFIELD) {
    uVar14 = (undefined1)this_00[1]._op;
  }
  else {
    uVar14 = TO_BLOCK;
  }
  bVar2 = call->_nullable;
  this->_donot_get = true;
  Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
  this->_donot_get = false;
  TVar3 = this_00->_op;
  if (TVar3 - TO_GETFIELD < 4) {
    bVar18 = *(int *)(this_00[1].super_ArenaObj._vptr_ArenaObj + 3) != 0x3a;
  }
  else {
    bVar18 = TVar3 == TO_ROOT_TABLE_ACCESS;
  }
  if (bVar18) {
    if ((uVar14 == TO_BLOCK && bVar2 == false) && ((this->_fs->lang_features & 0x800) == 0)) {
      SVar10 = SQFuncState::PopTarget(this->_fs);
      SVar11 = SQFuncState::PopTarget(this->_fs);
      SVar12 = SQFuncState::PushTarget(this->_fs,-1);
      SVar13 = SQFuncState::PushTarget(this->_fs,-1);
      Var8 = _uStack_52;
      pSVar15 = this->_fs;
      local_58[5] = (char)SVar12;
      local_58._0_4_ = 0;
      local_58[4] = '\a';
      local_58._0_4_ = (SQObjectType)SVar10;
      uStack_52 = (char)SVar11;
      local_50.nInteger = SUB108(Var8,2);
      bStack_51 = (uchar)SVar13;
    }
    else {
      SVar10 = SQFuncState::GetUpTarget(this->_fs,1);
      local_38 = SQFuncState::PushTarget(this->_fs,-1);
      Var8 = _uStack_52;
      local_58[5] = (char)local_38;
      local_58._0_4_ = 0;
      local_58[4] = '\n';
      local_58._0_4_ = (SQObjectType)SVar10;
      SVar6 = _local_58;
      local_50.nInteger = SUB108(Var8,2);
      local_58 = SVar6._0_6_;
      _uStack_52 = 0;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)local_58);
      SQFuncState::PopTarget(this->_fs);
      bVar19 = 8;
      if (uVar14 == TO_BLOCK) {
        bVar19 = (this->_fs->lang_features & 0x800) == 0;
      }
      local_40 = SQFuncState::PopTarget(this->_fs);
      local_48 = SQFuncState::PopTarget(this->_fs);
      pSVar15 = this->_fs;
      SVar10 = SQFuncState::PushTarget(pSVar15,-1);
      SVar6 = _local_58;
      local_58[5] = (char)SVar10;
      local_58._0_4_ = 0;
      local_58[4] = '\x11';
      local_58._0_4_ = (SQObjectType)local_40;
      uStack_52 = (char)local_48;
      bStack_51 = bVar19 | 2;
      if (bVar2 == false) {
        bStack_51 = bVar19;
      }
      local_50 = SVar6._unVal;
      SQFuncState::AddInstruction(pSVar15,(SQInstruction *)local_58);
      SVar10 = SQFuncState::PushTarget(this->_fs,-1);
      SVar6 = _local_58;
      pSVar15 = this->_fs;
      local_58[5] = (char)SVar10;
      local_58._0_4_ = 0;
      local_58[4] = '\n';
      local_58._0_4_ = (SQObjectType)local_38;
      SVar7 = _local_58;
      local_50 = SVar6._unVal;
      local_58 = SVar7._0_6_;
      _uStack_52 = 0;
    }
  }
  else {
    if (TVar3 == TO_ID) {
      pSVar15 = this->_fs;
      _local_58 = SQFuncState::CreateString
                            (pSVar15,(SQChar *)this_00[1].super_ArenaObj._vptr_ArenaObj,-1);
      if (((undefined1  [16])_local_58 & (undefined1  [16])0x8000000) != (undefined1  [16])0x0) {
        pSVar1 = &((local_58._8_8_.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      local_59 = false;
      SVar10 = SQFuncState::GetOuterVariable(pSVar15,(SQObject *)local_58,&local_59);
      bVar18 = SVar10 != -1;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_58);
    }
    else {
      SVar10 = 0xffffffff;
      bVar18 = false;
    }
    pSVar15 = this->_fs;
    SVar11 = SQFuncState::PushTarget(pSVar15,-1);
    Var8 = _uStack_52;
    SVar9.nInteger = local_50.nInteger;
    if (bVar18) {
      local_58[5] = (char)SVar11;
      local_58._0_4_ = 0;
      local_58[4] = ')';
      _local_58 = (SQObject)CONCAT106(Var8,local_58);
      local_58._0_4_ = (SQObjectType)SVar10;
      _uStack_52 = 0;
      _local_58 = (SQObject)CONCAT88(SVar9.pTable,_local_58);
      SQFuncState::AddInstruction(pSVar15,(SQInstruction *)local_58);
      pSVar15 = this->_fs;
      SVar10 = SQFuncState::PushTarget(pSVar15,-1);
      SVar6 = _local_58;
      local_58[5] = (char)SVar10;
      local_58._0_4_ = 0;
      local_58[4] = '\n';
      local_58 = (undefined1  [6])(local_58._4_6_ << 0x20);
      local_50 = SVar6._unVal;
      _uStack_52 = 0;
    }
    else {
      local_58[5] = (char)SVar11;
      local_58._0_4_ = 0;
      local_58[4] = '\n';
      _local_58 = (SQObject)CONCAT106(Var8,local_58);
      local_58 = (undefined1  [6])(local_58._4_6_ << 0x20);
      _uStack_52 = 0;
      _local_58 = (SQObject)CONCAT88(SVar9.pTable,_local_58);
    }
  }
  SQFuncState::AddInstruction(pSVar15,(SQInstruction *)local_58);
  uVar17 = (ulong)(call->_args)._size;
  if (uVar17 != 0) {
    ppEVar4 = (call->_args)._vals;
    lVar16 = 0;
    do {
      Node::visit<SQCompilation::CodegenVisitor>(*(Node **)((long)ppEVar4 + lVar16),this);
      MoveIfCurrentTargetIsLocal(this);
      lVar16 = lVar16 + 8;
    } while (uVar17 << 3 != lVar16);
  }
  if ((call->_args)._size != 0) {
    uVar17 = 0;
    do {
      SQFuncState::PopTarget(this->_fs);
      uVar17 = uVar17 + 1;
    } while (uVar17 < (call->_args)._size);
  }
  SVar10 = SQFuncState::PopTarget(this->_fs);
  SVar11 = SQFuncState::PopTarget(this->_fs);
  SVar12 = SQFuncState::PushTarget(this->_fs,-1);
  SVar6 = _local_58;
  uVar14 = 6;
  if (bVar2 != false) {
    uVar14 = 0x49;
  }
  auVar5._1_11_ = stack0xffffffffffffffad;
  auVar5[0] = uVar14;
  local_58._0_5_ = auVar5._0_5_ << 0x20;
  _uStack_52 = SVar6._6_10_;
  local_58[5] = (char)SVar12;
  local_58._0_4_ = (SQObjectType)SVar11;
  uStack_52 = (char)SVar10;
  local_50 = SVar6._unVal;
  bStack_51 = (char)(call->_args)._size + '\x01';
  SQFuncState::AddInstruction(this->_fs,(SQInstruction *)local_58);
  return;
}

Assistant:

void CodegenVisitor::visitCallExpr(CallExpr *call) {
    maybeAddInExprLine(call);

    Expr *callee = deparen(call->callee());
    bool isNullCall = call->isNullable();
    bool isTypeMethod = false;
    if (callee->op() == TO_GETFIELD) {
        isTypeMethod = callee->asGetField()->isTypeMethod();
    }

    visitNoGet(callee);

    SQInteger outerPos = -1;

    if (isCalleeAnObject(callee)) {
        if (!isNullCall && !isTypeMethod && ((_fs->lang_features & LF_FORBID_IMPLICIT_DEF_DELEGATE) == 0)) {
            SQInteger key = _fs->PopTarget();  /* location of the key */
            SQInteger table = _fs->PopTarget();  /* location of the object */
            SQInteger closure = _fs->PushTarget(); /* location for the closure */
            SQInteger ttarget = _fs->PushTarget(); /* location for 'this' pointer */
            _fs->AddInstruction(_OP_PREPCALL, closure, key, table, ttarget);
        }
        else {
            SQInteger self = _fs->GetUpTarget(1);  /* location of the object */
            SQInteger storedSelf = _fs->PushTarget();
            _fs->AddInstruction(_OP_MOVE, storedSelf, self);
            _fs->PopTarget();
            SQInteger flags = 0;
            if (isTypeMethod) {
                flags |= OP_GET_FLAG_TYPE_METHODS_ONLY;
            } else if ((_fs->lang_features & LF_FORBID_IMPLICIT_DEF_DELEGATE) == 0) {
                flags |= OP_GET_FLAG_ALLOW_DEF_DELEGATE;
            }
            if (isNullCall)
              flags |= OP_GET_FLAG_NO_ERROR;

            SQInteger key = _fs->PopTarget();
            SQInteger src = _fs->PopTarget();
            _fs->AddInstruction(_OP_GET, _fs->PushTarget(), key, src, flags);
            SQInteger ttarget = _fs->PushTarget();
            _fs->AddInstruction(_OP_MOVE, ttarget, storedSelf);
        }
    }
    else if (isCalleeAnOuter(_fs, callee, outerPos)) {
        _fs->AddInstruction(_OP_GETOUTER, _fs->PushTarget(), outerPos);
        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
    }
    else {
        _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), 0);
    }

    const auto &args = call->arguments();

    for (auto arg : args) {
        arg->visit(this);
        MoveIfCurrentTargetIsLocal();
    }

    for (SQUnsignedInteger i = 0; i < args.size(); ++i) {
        _fs->PopTarget();
    }

    SQInteger stackbase = _fs->PopTarget();
    SQInteger closure = _fs->PopTarget();
    SQInteger target = _fs->PushTarget();
    assert(target >= -1);
    assert(target < 255);
    _fs->AddInstruction(isNullCall ? _OP_NULLCALL : _OP_CALL, target, closure, stackbase, args.size() + 1);
}